

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_contexts.hpp
# Opt level: O2

void __thiscall timing_registry::addToGroup(timing_registry *this,uint64_t guid,task_handle *hTask)

{
  iterator iVar1;
  uint64_t local_30;
  uint64_t local_28;
  
  local_30 = guid;
  std::recursive_mutex::lock(&this->m);
  local_28 = oqpi::task_handle::getUID(hTask);
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_timing_registry::task_info>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->tasks)._M_h,&local_28);
  *(uint64_t *)
   ((long)iVar1.
          super__Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false>
          ._M_cur + 0x78) = guid;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_timing_registry::task_info>,_std::allocator<std::pair<const_unsigned_long,_timing_registry::task_info>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->tasks)._M_h,&local_30);
  std::vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_>::
  emplace_back<oqpi::task_handle>
            ((vector<oqpi::task_handle,_std::allocator<oqpi::task_handle>_> *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false>
                    ._M_cur + 0x58),hTask);
  *(undefined1 *)
   ((long)iVar1.
          super__Node_iterator_base<std::pair<const_unsigned_long,_timing_registry::task_info>,_false>
          ._M_cur + 0x70) = 1;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void addToGroup(uint64_t guid, oqpi::task_handle hTask)
    {
        std::lock_guard<std::recursive_mutex> __l(m);
        // Flag the task as having a parent
        auto tit = tasks.find(hTask.getUID());
        tit->second.parentUID = guid;
        // Add this task to the parent
        auto git = tasks.find(guid);
        git->second.children.emplace_back(std::move(hTask));
        git->second.isGroup = true;
    }